

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int make_absent_tree(Node **node,Node *absent,Node *expr,int is_range_cutter,ParseEnv *env)

{
  NodeType NVar1;
  Bits BVar2;
  int upper;
  int pre_save_right_id;
  bool bVar3;
  int iVar4;
  Node *node_00;
  Node *pNVar5;
  _Node *step_one;
  uint possessive;
  BagNode *en;
  int iVar6;
  long lVar7;
  _Node *p_Var8;
  bool bVar9;
  bool bVar10;
  Node *ns [7];
  Node *local_58 [5];
  
  pNVar5 = (Node *)(ulong)(uint)is_range_cutter;
  ns[2] = (Node *)0x0;
  ns[3] = (Node *)0x0;
  ns[0] = (Node *)0x0;
  ns[1] = (Node *)0x0;
  ns[6] = (Node *)0x0;
  ns[4] = expr;
  ns[5] = absent;
  if (is_range_cutter == 0) {
    if (expr == (Node *)0x0) {
      node_00 = (Node *)malloc(0x48);
      if (node_00 == (Node *)0x0) {
        node_00 = (Node *)0x0;
      }
      else {
        (node_00->u).quant.next_head_exact = (_Node *)0x0;
        (node_00->u).cclass.mbuf = (BBuf *)0x0;
        (node_00->u).call.name = (OnigUChar *)0x0;
        (node_00->u).quant.head_exact = (_Node *)0x0;
        (node_00->u).base.body = (_Node *)0x0;
        (node_00->u).str.end = (OnigUChar *)0x0;
        *(undefined8 *)&node_00->u = 0;
        (node_00->u).base.parent = (_Node *)0x0;
        *(undefined8 *)((long)&node_00->u + 0x40) = 0;
      }
      if (node_00 == (Node *)0x0) {
        node_00 = (Node *)0x0;
      }
      else {
        (node_00->u).base.node_type = ND_QUANT;
        (node_00->u).str.end = (OnigUChar *)0xffffffff00000000;
        (node_00->u).str.flag = 1;
        *(undefined8 *)((long)&(node_00->u).call.name + 4) = 0;
        *(undefined8 *)((long)&(node_00->u).quant.head_exact + 4) = 0;
        (node_00->u).quant.next_head_exact = (_Node *)0x0;
        (node_00->u).cclass.mbuf = (BBuf *)0x0;
      }
      if (node_00 == (Node *)0x0) {
        iVar6 = 5;
        goto LAB_00118bcf;
      }
      step_one = node_new_anychar(4);
      if (step_one != (Node *)0x0) {
        possessive = 0;
        goto LAB_00118bd9;
      }
      iVar4 = -5;
LAB_00118d7d:
      node_free_body(node_00);
      free(node_00);
LAB_00118d8d:
      iVar6 = 6;
    }
    else {
      NVar1 = (expr->u).base.node_type;
      bVar3 = true;
      possessive = 0;
      node_00 = expr;
      if (NVar1 == ND_QUANT) {
LAB_00118b46:
        if ((node_00->u).str.flag == 0) goto LAB_00118bc1;
        step_one = (node_00->u).base.body;
        NVar1 = (step_one->u).base.node_type;
        if (NVar1 != ND_CCLASS) {
          if (NVar1 == ND_STRING) {
            p_Var8 = (step_one->u).base.body;
            if ((_Node *)(step_one->u).str.end <= p_Var8) {
              node_00 = (Node *)0x0;
              step_one = (_Node *)0x0;
              goto LAB_00118bc6;
            }
            iVar6 = 1;
            do {
              iVar4 = (*env->enc->mbc_enc_len)((OnigUChar *)p_Var8);
              p_Var8 = (_Node *)((long)&p_Var8->u + (long)iVar4);
              iVar6 = iVar6 + -1;
            } while (p_Var8 < (_Node *)(step_one->u).str.end);
            if (iVar6 == 0) goto LAB_00118dc0;
          }
          goto LAB_00118bc1;
        }
LAB_00118dc0:
        if (node_00 != expr) {
          (expr->u).base.body = (_Node *)0x0;
          node_free_body(expr);
          free(expr);
        }
        (node_00->u).base.body = (_Node *)0x0;
        bVar3 = false;
      }
      else {
        if (NVar1 == ND_BAG) {
          bVar9 = (expr->u).cclass.bs[1] != 2;
          if (bVar9) {
            bVar10 = false;
          }
          else {
            pNVar5 = (expr->u).base.body;
            bVar10 = (pNVar5->u).base.node_type == ND_QUANT;
          }
          possessive = (uint)!bVar9;
          node_00 = pNVar5;
          if (bVar10) goto LAB_00118b46;
        }
LAB_00118bc1:
        bVar3 = true;
        node_00 = (Node *)0x0;
        step_one = (_Node *)0x0;
      }
LAB_00118bc6:
      if (bVar3) {
        iVar6 = 0;
LAB_00118bcf:
        iVar4 = -5;
      }
      else {
LAB_00118bd9:
        *node = (Node *)0x0;
        local_58[0] = (Node *)0x0;
        local_58[1] = (Node *)0x0;
        iVar6 = (node_00->u).quant.lower;
        upper = (node_00->u).quant.upper;
        local_58[2] = step_one;
        local_58[3] = absent;
        iVar4 = node_new_save_gimmick(local_58,SAVE_RIGHT_RANGE,env);
        if (iVar4 == 0) {
          pre_save_right_id = (local_58[0]->u).quant.upper;
          iVar4 = make_absent_engine(local_58 + 1,pre_save_right_id,absent,step_one,iVar6,upper,
                                     possessive,0,env);
          if (iVar4 != 0) goto LAB_00118c55;
          local_58[2] = (Node *)malloc(0x48);
          local_58[3] = (Node *)0x0;
          if (local_58[2] == (Node *)0x0) {
            local_58[2] = (Node *)0x0;
          }
          else {
            (local_58[2]->u).quant.next_head_exact = (_Node *)0x0;
            (local_58[2]->u).cclass.mbuf = (BBuf *)0x0;
            (local_58[2]->u).call.name = (OnigUChar *)0x0;
            (local_58[2]->u).quant.head_exact = (_Node *)0x0;
            (local_58[2]->u).base.body = (_Node *)0x0;
            (local_58[2]->u).str.end = (OnigUChar *)0x0;
            *(undefined8 *)&local_58[2]->u = 0;
            (local_58[2]->u).base.parent = (_Node *)0x0;
            *(undefined8 *)((long)&local_58[2]->u + 0x40) = 0;
          }
          if (local_58[2] == (Node *)0x0) {
            iVar4 = -5;
            goto LAB_00118c55;
          }
          (local_58[2]->u).base.node_type = ND_GIMMICK;
          (local_58[2]->u).quant.upper = pre_save_right_id;
          (local_58[2]->u).base.body = (_Node *)0x200000002;
          pNVar5 = make_list_or_alt(ND_LIST,3,local_58);
          if (pNVar5 == (Node *)0x0) {
            iVar4 = -5;
            goto LAB_00118c55;
          }
          *node = pNVar5;
          iVar4 = 0;
        }
        else {
LAB_00118c55:
          lVar7 = 0;
          do {
            pNVar5 = local_58[lVar7];
            if (pNVar5 != (Node *)0x0) {
              node_free_body(pNVar5);
              free(pNVar5);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
        }
        if (node_00 != (Node *)0x0) {
          node_free_body(node_00);
          free(node_00);
        }
        if (iVar4 != 0) {
          ns[4] = (Node *)0x0;
          node_00 = step_one;
          if (step_one != (Node *)0x0) goto LAB_00118d7d;
          goto LAB_00118d8d;
        }
        iVar6 = 1;
        iVar4 = 0;
      }
    }
    if (iVar6 == 6) goto LAB_001189f3;
    if (iVar6 != 5) {
      if (iVar6 != 0) {
        return 0;
      }
      goto LAB_001189ba;
    }
  }
  else {
LAB_001189ba:
    iVar4 = node_new_save_gimmick(ns,SAVE_RIGHT_RANGE,env);
    if (iVar4 != 0) goto LAB_001189f3;
    iVar6 = (ns[0]->u).quant.upper;
    iVar4 = node_new_save_gimmick(ns + 1,SAVE_S,env);
    if (iVar4 != 0) goto LAB_001189f3;
    BVar2 = (ns[1]->u).cclass.bs[2];
    pNVar5 = node_new_anychar(4);
    if (pNVar5 == (Node *)0x0) {
      iVar4 = -5;
      goto LAB_001189f3;
    }
    ns[3] = pNVar5;
    iVar4 = make_absent_engine(ns + 2,iVar6,absent,pNVar5,0,-1,1,is_range_cutter,env);
    if (iVar4 != 0) goto LAB_001189f3;
    ns[3] = (Node *)0x0;
    ns[5] = (Node *)0x0;
    pNVar5 = (Node *)malloc(0x48);
    ns[3] = (Node *)0x0;
    if (pNVar5 != (Node *)0x0) {
      (pNVar5->u).quant.next_head_exact = (_Node *)0x0;
      (pNVar5->u).cclass.mbuf = (BBuf *)0x0;
      (pNVar5->u).call.name = (OnigUChar *)0x0;
      (pNVar5->u).quant.head_exact = (_Node *)0x0;
      (pNVar5->u).base.body = (_Node *)0x0;
      (pNVar5->u).str.end = (OnigUChar *)0x0;
      *(undefined8 *)&pNVar5->u = 0;
      (pNVar5->u).base.parent = (_Node *)0x0;
      *(undefined8 *)((long)&pNVar5->u + 0x40) = 0;
      ns[3] = pNVar5;
    }
    if (ns[3] == (Node *)0x0) {
      iVar4 = -5;
      goto LAB_001189f3;
    }
    (ns[3]->u).base.node_type = ND_GIMMICK;
    (ns[3]->u).cclass.bs[2] = BVar2;
    (ns[3]->u).base.body = (_Node *)0x100000002;
    if (is_range_cutter == 0) {
      iVar4 = make_absent_tail(ns + 5,ns + 6,iVar6,env);
      if (iVar4 != 0) goto LAB_001189f3;
      iVar6 = 7;
    }
    else {
      iVar6 = 4;
    }
    pNVar5 = make_list_or_alt(ND_LIST,iVar6,ns);
    if (pNVar5 != (Node *)0x0) {
      *node = pNVar5;
      return 0;
    }
  }
  iVar4 = -5;
LAB_001189f3:
  lVar7 = 0;
  do {
    pNVar5 = ns[lVar7];
    if (pNVar5 != (Node *)0x0) {
      node_free_body(pNVar5);
      free(pNVar5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  return iVar4;
}

Assistant:

static int
make_absent_tree(Node** node, Node* absent, Node* expr, int is_range_cutter,
                 ParseEnv* env)
{
  int r;
  int i;
  int id1, id2;
  int possessive;
  Node* x;
  Node* ns[7];

  r = ONIGERR_MEMORY;
  for (i = 0; i < 7; i++) ns[i] = NULL_NODE;
  ns[4] = expr; ns[5] = absent;

  if (is_range_cutter == 0) {
    Node* quant;
    Node* body;

    if (expr == NULL_NODE) {
      /* default expr \O* */
      quant = node_new_quantifier(0, INFINITE_REPEAT, FALSE);
      if (IS_NULL(quant)) goto err0;

      r = node_new_true_anychar(&body);
      if (r != 0) {
        onig_node_free(quant);
        goto err;
      }
      possessive = 0;
      goto simple;
    }
    else {
      if (is_simple_one_char_repeat(expr, &quant, &body, &possessive, env)) {
      simple:
        r = make_absent_tree_for_simple_one_char_repeat(node, absent, quant,
                                                        body, possessive, env);
        onig_node_free(quant);
        if (r != 0) {
          ns[4] = NULL_NODE;
          onig_node_free(body);
          goto err;
        }

        return ONIG_NORMAL;
      }
    }
  }

  r = node_new_save_gimmick(&ns[0], SAVE_RIGHT_RANGE, env);
  if (r != 0) goto err;

  id1 = GIMMICK_(ns[0])->id;

  r = node_new_save_gimmick(&ns[1], SAVE_S, env);
  if (r != 0) goto err;

  id2 = GIMMICK_(ns[1])->id;

  r = node_new_true_anychar(&ns[3]);
  if (r != 0) goto err;

  possessive = 1;
  r = make_absent_engine(&ns[2], id1, absent, ns[3], 0, INFINITE_REPEAT,
                         possessive, is_range_cutter, env);
  if (r != 0) goto err;

  ns[3] = NULL_NODE;
  ns[5] = NULL_NODE;

  r = node_new_update_var_gimmick(&ns[3], UPDATE_VAR_S_FROM_STACK, id2, env);
  if (r != 0) goto err;

  if (is_range_cutter != 0) {
    x = make_list(4, ns);
    if (IS_NULL(x)) goto err0;
  }
  else {
    r = make_absent_tail(&ns[5], &ns[6], id1, env);
    if (r != 0) goto err;

    x = make_list(7, ns);
    if (IS_NULL(x)) goto err0;
  }

  *node = x;
  return ONIG_NORMAL;

 err0:
  r = ONIGERR_MEMORY;
 err:
  for (i = 0; i < 7; i++) onig_node_free(ns[i]);
  return r;
}